

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnRefIsNullExpr(TypeChecker *this)

{
  Result RVar1;
  Result RVar2;
  Type type;
  Type local_20;
  
  RVar1 = PeekType(this,0,&local_20);
  if ((7 < (uint)(local_20.enum_ + 0x17)) || ((0xc5U >> (local_20.enum_ + 0x17 & 0x1fU) & 1) == 0))
  {
    local_20.enum_ = Reference;
    local_20.type_index_ = 0xffffffff;
  }
  RVar2 = PopAndCheck1Type(this,local_20,"ref.is_null");
  PushType(this,(Type)0xffffffff);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::OnRefIsNullExpr() {
  Type type;
  Result result = PeekType(0, &type);
  if (!type.IsRef()) {
    type = Type(Type::Reference, kInvalidIndex);
  }
  result |= PopAndCheck1Type(type, "ref.is_null");
  PushType(Type::I32);
  return result;
}